

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixStrideCaseBlockContentCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedBasicTypeCases,bool opaqueCases)

{
  ProgramInterface PVar1;
  NodeType NVar2;
  Node *this;
  TestNode *pTVar3;
  TestContext *pTVar4;
  LayoutQualifier *this_00;
  TestNode *pTVar5;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  TestNode *local_88;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  undefined1 local_68 [8];
  Layout layout;
  TestCaseGroup *qualifierGroup;
  SharedPtr subStructure;
  int qualifierNdx;
  ProgramResourceQueryTestTarget queryTarget;
  bool opaqueCases_local;
  bool extendedBasicTypeCases_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)((long)&subStructure.m_state + 4),
             PROGRAMINTERFACE_UNIFORM,0x80);
  subStructure.m_state._0_4_ = 0;
  do {
    if (2 < (int)subStructure.m_state) {
      return;
    }
    if (generateUniformMatrixStrideCaseBlockContentCases::qualifiers[(int)subStructure.m_state].
        order == MATRIXORDER_LAST) {
LAB_02230cf8:
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&qualifierGroup,parentStructure);
      pTVar3 = (TestNode *)operator_new(0x70);
      pTVar4 = gles31::Context::getTestContext(context);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar3,pTVar4,
                 generateUniformMatrixStrideCaseBlockContentCases::qualifiers
                 [(int)subStructure.m_state].name,"");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
      if (generateUniformMatrixStrideCaseBlockContentCases::qualifiers[(int)subStructure.m_state].
          order != MATRIXORDER_LAST) {
        glu::Layout::Layout((Layout *)local_68,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
        layout.offset =
             generateUniformMatrixStrideCaseBlockContentCases::qualifiers[(int)subStructure.m_state]
             .order;
        this_00 = (LayoutQualifier *)operator_new(0x38);
        ResourceDefinition::LayoutQualifier::LayoutQualifier
                  (this_00,(SharedPtr *)&qualifierGroup,(Layout *)local_68);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&blockGroup,(Node *)this_00);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&qualifierGroup,
                  (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&blockGroup);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&blockGroup);
      }
      PVar1 = subStructure.m_state._4_4_;
      if (extendedBasicTypeCases) {
        if (generateUniformMatrixStrideCaseBlockContentCases::qualifiers[(int)subStructure.m_state].
            order == MATRIXORDER_LAST) {
          pTVar5 = (TestNode *)operator_new(0x70);
          pTVar4 = gles31::Context::getTestContext(context);
          tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,pTVar4,"types","");
          blockGroup_1 = (TestCaseGroup *)pTVar5;
          tcu::TestNode::addChild(pTVar3,pTVar5);
          generateVariableCases
                    (context,(SharedPtr *)&qualifierGroup,blockGroup_1,
                     (ProgramResourceQueryTestTarget *)((long)&subStructure.m_state + 4),1,false);
          generateMatrixVariableCases
                    (context,(SharedPtr *)&qualifierGroup,blockGroup_1,
                     (ProgramResourceQueryTestTarget *)((long)&subStructure.m_state + 4),false,2);
          if (opaqueCases) {
            generateOpaqueTypeCases
                      (context,(SharedPtr *)&qualifierGroup,blockGroup_1,
                       (ProgramResourceQueryTestTarget *)((long)&subStructure.m_state + 4),2,false);
          }
        }
        else {
          generateMatrixVariableCases
                    (context,(SharedPtr *)&qualifierGroup,(TestCaseGroup *)pTVar3,
                     (ProgramResourceQueryTestTarget *)((long)&subStructure.m_state + 4),true,2);
        }
        pTVar5 = (TestNode *)operator_new(0x70);
        pTVar4 = gles31::Context::getTestContext(context);
        tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,pTVar4,"aggregates","");
        local_88 = pTVar5;
        tcu::TestNode::addChild(pTVar3,pTVar5);
        PVar1 = subStructure.m_state._4_4_;
        pTVar3 = local_88;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
        generateBufferBackedVariableAggregateTypeCases
                  (context,(SharedPtr *)&qualifierGroup,(TestCaseGroup *)pTVar3,PVar1,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,&local_a8,1);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
        generateBufferBackedVariableAggregateTypeCases
                  (context,(SharedPtr *)&qualifierGroup,(TestCaseGroup *)pTVar3,PVar1,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,&local_d0,1);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&qualifierGroup);
    }
    else {
      this = de::
             SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             ::operator->(parentStructure);
      NVar2 = ResourceDefinition::Node::getType(this);
      if (NVar2 == TYPE_INTERFACE_BLOCK) goto LAB_02230cf8;
    }
    subStructure.m_state._0_4_ = (int)subStructure.m_state + 1;
  } while( true );
}

Assistant:

static void generateUniformMatrixStrideCaseBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, bool extendedBasicTypeCases, bool opaqueCases)
{
	static const struct
	{
		const char*			name;
		glu::MatrixOrder	order;
	} qualifiers[] =
	{
		{ "no_qualifier",	glu::MATRIXORDER_LAST			},
		{ "row_major",		glu::MATRIXORDER_ROW_MAJOR		},
		{ "column_major",	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ProgramResourceQueryTestTarget queryTarget(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_MATRIX_STRIDE);

	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		// Add layout qualifiers only for block members
		if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST || parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK)
		{
			ResourceDefinition::Node::SharedPtr	subStructure	= parentStructure;
			tcu::TestCaseGroup* const			qualifierGroup	= new tcu::TestCaseGroup(context.getTestContext(), qualifiers[qualifierNdx].name, "");

			targetGroup->addChild(qualifierGroup);

			if (qualifiers[qualifierNdx].order != glu::MATRIXORDER_LAST)
			{
				glu::Layout layout;
				layout.matrixOrder = qualifiers[qualifierNdx].order;
				subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
			}

			if (extendedBasicTypeCases)
			{
				// .types
				// .matrix
				if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST)
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "");
					qualifierGroup->addChild(blockGroup);

					generateVariableCases(context, subStructure, blockGroup, queryTarget, 1, false);
					generateMatrixVariableCases(context, subStructure, blockGroup, queryTarget, false);
					if (opaqueCases)
						generateOpaqueTypeCases(context, subStructure, blockGroup, queryTarget, 2, false);
				}
				else
					generateMatrixVariableCases(context, subStructure, qualifierGroup, queryTarget);

				// .aggregates
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "");
					qualifierGroup->addChild(blockGroup);

					generateBufferBackedVariableAggregateTypeCases(context, subStructure, blockGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
				}
			}
			else
				generateBufferBackedVariableAggregateTypeCases(context, subStructure, qualifierGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
		}
	}
}